

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

ImportSourcePtr createBaseModelImport(ModelPtr *importModel,string *resourcePath)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ImportSourcePtr IVar2;
  allocator<char> local_91;
  string local_90 [35];
  undefined1 local_6d;
  string local_60 [32];
  shared_ptr<libcellml::Model> local_40;
  undefined1 local_30 [8];
  ParserPtr parser;
  string *resourcePath_local;
  ModelPtr *importModel_local;
  ImportSourcePtr *import;
  
  libcellml::Parser::create
            (SUB81((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_30,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  fileContents(local_60);
  libcellml::Parser::parseModel((string *)&local_40);
  std::shared_ptr<libcellml::Model>::operator=
            ((shared_ptr<libcellml::Model> *)resourcePath,&local_40);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_40);
  std::__cxx11::string::~string(local_60);
  local_6d = 0;
  libcellml::ImportSource::create();
  peVar1 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)importModel);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"I_am_a_url",&local_91);
  libcellml::ImportSource::setUrl((string *)peVar1);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  peVar1 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)importModel);
  libcellml::ImportSource::setModel((shared_ptr *)peVar1);
  local_6d = 1;
  std::shared_ptr<libcellml::Parser>::~shared_ptr((shared_ptr<libcellml::Parser> *)local_30);
  IVar2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  IVar2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)importModel;
  return (ImportSourcePtr)
         IVar2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ImportSourcePtr createBaseModelImport(libcellml::ModelPtr &importModel, const std::string &resourcePath)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();

    importModel = parser->parseModel(fileContents(resourcePath));

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");
    import->setModel(importModel);

    return import;
}